

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printFlagBitsJSON(uint32_t indent,char *nl,uint32_t flags,
                      _func_char_ptr_uint32_t__Bool *toStringFn)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  code *in_RCX;
  uint in_EDX;
  char *in_RSI;
  uint in_EDI;
  bool bVar5;
  char *str;
  _Bool bit_value;
  uint32_t bit_mask;
  uint32_t bit_index;
  _Bool first;
  char *local_58;
  char *local_48;
  uint local_28;
  
  bVar1 = true;
  for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
    uVar2 = 1 << ((byte)local_28 & 0x1f);
    bVar5 = (uVar2 & in_EDX) != 0;
    lVar3 = (*in_RCX)(local_28,bVar5);
    if (lVar3 == 0) {
      if (bVar5) {
        pcVar4 = ",";
        local_58 = in_RSI;
        if (bVar1) {
          pcVar4 = "";
          local_58 = "";
        }
        printf("%s%s%*s%u",pcVar4,local_58,(ulong)in_EDI,"",(ulong)uVar2);
        bVar1 = false;
      }
    }
    else {
      pcVar4 = ",";
      local_48 = in_RSI;
      if (bVar1) {
        pcVar4 = "";
        local_48 = "";
      }
      printf("%s%s%*s\"%s\"",pcVar4,local_48,(ulong)in_EDI,"",lVar3);
      bVar1 = false;
    }
  }
  if (!bVar1) {
    printf("%s",in_RSI);
  }
  return;
}

Assistant:

static void printFlagBitsJSON(uint32_t indent, const char* nl, uint32_t flags, const char*(*toStringFn)(uint32_t, bool)) {
    bool first = true;
    for (uint32_t bit_index = 0; bit_index < 32; ++bit_index) {
        uint32_t bit_mask = 1u << bit_index;
        bool bit_value = (bit_mask & (uint32_t) flags) != 0;

        const char* str = toStringFn(bit_index, bit_value);
        if (str) {
            printf("%s%s%*s\"%s\"", first ? "" : ",", first ? "" : nl, indent, "", str);
            first = false;
        } else if (bit_value) {
            printf("%s%s%*s%u", first ? "" : ",", first ? "" : nl, indent, "", bit_mask);
            first = false;
        }
    }
    if (!first)
        printf("%s", nl);
}